

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

wasm_functype_t * wasm_functype_new(wasm_valtype_vec_t *params,wasm_valtype_vec_t *results)

{
  ExternType *pEVar1;
  Type *pTVar2;
  FILE *pFVar3;
  bool bVar4;
  wasm_functype_t *this;
  Type *pTVar5;
  Type type;
  string local_60;
  ExternType *local_40;
  wasm_functype_t *local_38;
  
  fprintf(_stderr,"CAPI: [%s] params=%zx args=%zx\n","wasm_functype_new",params->size,results->size)
  ;
  this = (wasm_functype_t *)operator_new(0x30);
  wasm_functype_t::wasm_functype_t(this,params,results);
  fprintf(_stderr,"CAPI: [%s] ","wasm_functype_new");
  pEVar1 = (this->super_wasm_externtype_t).I._M_t.
           super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
           .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
  local_38 = this;
  if (pEVar1->kind == First) {
    fputc(0x28,_stderr);
    pTVar5 = (Type *)pEVar1[1]._vptr_ExternType;
    pTVar2 = *(Type **)&pEVar1[1].kind;
    local_40 = pEVar1;
    if (pTVar5 != pTVar2) {
      bVar4 = true;
      do {
        type = *pTVar5;
        if (!bVar4) {
          fwrite(", ",2,1,_stderr);
        }
        pFVar3 = _stderr;
        wabt::Type::GetName_abi_cxx11_(&local_60,&type);
        fputs(local_60._M_dataplus._M_p,pFVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pTVar5 = pTVar5 + 1;
        bVar4 = false;
      } while (pTVar5 != pTVar2);
    }
    fwrite(") -> (",6,1,_stderr);
    pTVar5 = *(Type **)&local_40[2].kind;
    pTVar2 = (Type *)local_40[3]._vptr_ExternType;
    if (pTVar5 != pTVar2) {
      bVar4 = true;
      do {
        type = *pTVar5;
        if (!bVar4) {
          fwrite(", ",2,1,_stderr);
        }
        pFVar3 = _stderr;
        wabt::Type::GetName_abi_cxx11_(&local_60,&type);
        fputs(local_60._M_dataplus._M_p,pFVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pTVar5 = pTVar5 + 1;
        bVar4 = false;
      } while (pTVar5 != pTVar2);
    }
    fwrite(")\n",2,1,_stderr);
    return local_38;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                ,0x4e,
                "Derived *wabt::cast(Base *) [Derived = wabt::interp::FuncType, Base = wabt::interp::ExternType]"
               );
}

Assistant:

own wasm_functype_t* wasm_functype_new(own wasm_valtype_vec_t* params,
                                       own wasm_valtype_vec_t* results) {
  TRACE("params=%" PRIzx " args=%" PRIzx, params->size, results->size);
  auto* res = new wasm_functype_t{params, results};
  TRACE_NO_NL("");
  print_sig(*res->As<FuncType>());
  return res;
}